

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc64ad.c
# Opt level: O2

int_t mc64id_(int_t *icntl)

{
  long lVar1;
  
  icntl[0] = 6;
  icntl[1] = 6;
  icntl[2] = -1;
  for (lVar1 = 0; lVar1 != 7; lVar1 = lVar1 + 1) {
    icntl[lVar1 + 3] = 0;
  }
  return 0;
}

Assistant:

int_t mc64id_(int_t *icntl)
{
    int_t i__;


/* *** Copyright (c) 1999  Council for the Central Laboratory of the */
/*     Research Councils                                             *** */
/* *** Although every effort has been made to ensure robustness and  *** */
/* *** reliability of the subroutines in this MC64 suite, we         *** */
/* *** disclaim any liability arising through the use or misuse of   *** */
/* *** any of the subroutines.                                       *** */
/* *** Any problems?   Contact ... */
/*     Iain Duff (I.Duff@rl.ac.uk) or Jacko Koster (jak@ii.uib.no)   *** */

/*  Purpose */
/*  ======= */

/*  The components of the array ICNTL control the action of MC64A/AD. */
/*  Default values for these are set in this subroutine. */

/*  Parameters */
/*  ========== */


/*  Local variables */

/*    ICNTL(1) has default value 6. */
/*     It is the output stream for error messages. If it */
/*     is negative, these messages will be suppressed. */

/*    ICNTL(2) has default value 6. */
/*     It is the output stream for warning messages. */
/*     If it is negative, these messages are suppressed. */

/*    ICNTL(3) has default value -1. */
/*     It is the output stream for monitoring printing. */
/*     If it is negative, these messages are suppressed. */

/*    ICNTL(4) has default value 0. */
/*     If left at the default value, the incoming data is checked for */
/*     out-of-range indices and duplicates.  Setting ICNTL(4) to any */
/*     other will avoid the checks but is likely to cause problems */
/*     later if out-of-range indices or duplicates are present. */
/*     The user should only set ICNTL(4) non-zero, if the data is */
/*     known to avoid these problems. */

/*    ICNTL(5) to ICNTL(10) are not used by MC64A/AD but are set to */
/*     zero in this routine. */
/* Initialization of the ICNTL array. */
    /* Parameter adjustments */
    --icntl;

    /* Function Body */
    icntl[1] = 6;
    icntl[2] = 6;
    icntl[3] = -1;
    for (i__ = 4; i__ <= 10; ++i__) {
	icntl[i__] = 0;
/* L10: */
    }
    return 0;
}